

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.cc
# Opt level: O2

ASN1_STRING * ASN1_STRING_dup(ASN1_STRING *a)

{
  int iVar1;
  ASN1_STRING *dst;
  
  if ((a != (ASN1_STRING *)0x0) && (dst = ASN1_STRING_new(), dst != (ASN1_STRING *)0x0)) {
    iVar1 = ASN1_STRING_copy(dst,a);
    if (iVar1 != 0) {
      return dst;
    }
    ASN1_STRING_free(dst);
  }
  return (ASN1_STRING *)0x0;
}

Assistant:

ASN1_STRING *ASN1_STRING_dup(const ASN1_STRING *str) {
  ASN1_STRING *ret;
  if (!str) {
    return NULL;
  }
  ret = ASN1_STRING_new();
  if (!ret) {
    return NULL;
  }
  if (!ASN1_STRING_copy(ret, str)) {
    ASN1_STRING_free(ret);
    return NULL;
  }
  return ret;
}